

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hh
# Opt level: O0

void __thiscall roaring::Roaring::Roaring(Roaring *this,Roaring *r)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  
  in_RDI[4] = in_RSI[4];
  uVar1 = *in_RSI;
  uVar2 = in_RSI[1];
  uVar3 = in_RSI[3];
  in_RDI[2] = in_RSI[2];
  in_RDI[3] = uVar3;
  *in_RDI = uVar1;
  in_RDI[1] = uVar2;
  roaring_bitmap_init_cleared((roaring_bitmap_t *)0x108e48);
  return;
}

Assistant:

Roaring(Roaring &&r) noexcept : roaring(r.roaring) {
        //
        // !!! This clones the bits of the roaring structure to a new location
        // and then overwrites the old bits...assuming that this will still
        // work.  There are scenarios where this could break; e.g. if some of
        // those bits were pointers into the structure memory itself.  If such
        // things were possible, a roaring_bitmap_move() API would be needed.
        //
        api::roaring_bitmap_init_cleared(&r.roaring);
    }